

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O1

void __thiscall embree::Points::Points(Points *this,Device *device,GType gtype)

{
  size_t *psVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  Device *pDVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  BufferView<embree::Vec3fx> *pBVar8;
  long *plVar9;
  BufferView<embree::Vec3fa> *pBVar10;
  BufferView<embree::Vec3fa> *pBVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  long lVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  
  Geometry::Geometry(&this->super_Geometry,device,gtype,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__Points_022067d0;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined8 *)&this->field_0x78 = 0x100000000;
  this->field_0x80 = 1;
  *(undefined8 *)&this->field_0x84 = 0;
  *(undefined8 *)&this->field_0x8c = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.num + 4) = 0;
  (this->normals0).super_RawBufferView.modCounter = 1;
  (this->normals0).super_RawBufferView.modified = true;
  (this->normals0).super_RawBufferView.userData = 0;
  (this->normals0).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  pDVar6 = (this->super_Geometry).device;
  (this->vertices).alloc.device = pDVar6;
  psVar1 = &(this->vertices).size_active;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fx> *)0x0;
  (this->normals).alloc.device = pDVar6;
  psVar2 = &(this->normals).size_active;
  (this->normals).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->normals).size_active = 0;
  (this->normals).size_alloced = 0;
  (this->vertexAttribs).alloc.device = pDVar6;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (BufferView<char> *)0x0;
  this->maxRadiusScale = 1.0;
  uVar27 = (ulong)(this->super_Geometry).numTimeSteps;
  if ((this->vertices).size_alloced == uVar27) {
    uVar26 = *psVar1;
    lVar22 = uVar27 - uVar26;
    if (uVar26 <= uVar27 && lVar22 != 0) {
      lVar23 = uVar26 * 0x38 + 0x30;
      do {
        pBVar7 = (this->vertices).items;
        puVar3 = (undefined8 *)((long)pBVar7 + lVar23 + -0x20);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)pBVar7 + lVar23 + -0x30);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined8 *)((long)pBVar7 + lVar23 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar7 + lVar23 + -8) = 1;
        *(undefined4 *)((long)pBVar7 + lVar23 + -4) = 0;
        *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar23) = 0;
        lVar23 = lVar23 + 0x38;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    *psVar1 = uVar27;
  }
  else {
    pDVar6 = (this->vertices).alloc.device;
    pBVar7 = (this->vertices).items;
    iVar21 = (*(pDVar6->super_State).super_RefCount._vptr_RefCount[8])(pDVar6,uVar27 * 0x38,8);
    (this->vertices).items = (BufferView<embree::Vec3fx> *)CONCAT44(extraout_var,iVar21);
    uVar26 = (this->vertices).size_active;
    if (uVar26 != 0) {
      lVar22 = 0x30;
      uVar24 = 0;
      do {
        pBVar8 = (this->vertices).items;
        puVar4 = (undefined4 *)((long)pBVar7 + lVar22 + -0x30);
        uVar12 = *puVar4;
        uVar13 = puVar4[1];
        uVar14 = puVar4[2];
        uVar15 = puVar4[3];
        puVar3 = (undefined8 *)((long)pBVar7 + lVar22 + -0x20);
        uVar16 = *puVar3;
        uVar17 = puVar3[1];
        puVar3 = (undefined8 *)((long)pBVar7 + lVar22 + -0x10);
        uVar18 = puVar3[1];
        puVar5 = (undefined8 *)((long)pBVar8 + lVar22 + -0x10);
        *puVar5 = *puVar3;
        puVar5[1] = uVar18;
        puVar3 = (undefined8 *)((long)pBVar8 + lVar22 + -0x20);
        *puVar3 = uVar16;
        puVar3[1] = uVar17;
        puVar4 = (undefined4 *)((long)pBVar8 + lVar22 + -0x30);
        *puVar4 = uVar12;
        puVar4[1] = uVar13;
        puVar4[2] = uVar14;
        puVar4[3] = uVar15;
        *(undefined8 *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar22) =
             *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar22);
        *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar22) = 0;
        uVar24 = uVar24 + 1;
        uVar26 = (this->vertices).size_active;
        lVar22 = lVar22 + 0x38;
      } while (uVar24 < uVar26);
    }
    lVar22 = uVar27 - uVar26;
    if (uVar26 <= uVar27 && lVar22 != 0) {
      lVar23 = uVar26 * 0x38 + 0x30;
      do {
        pBVar8 = (this->vertices).items;
        puVar3 = (undefined8 *)((long)pBVar8 + lVar23 + -0x20);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)pBVar8 + lVar23 + -0x30);
        *puVar3 = 0;
        puVar3[1] = 0;
        *(undefined8 *)((long)pBVar8 + lVar23 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar8 + lVar23 + -8) = 1;
        *(undefined4 *)((long)pBVar8 + lVar23 + -4) = 0;
        *(undefined8 *)((long)&(pBVar8->super_RawBufferView).ptr_ofs + lVar23) = 0;
        lVar23 = lVar23 + 0x38;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    pDVar6 = (this->vertices).alloc.device;
    if (pDVar6 != (Device *)0x0) {
      (*(pDVar6->super_State).super_RefCount._vptr_RefCount[9])(pDVar6,pBVar7);
    }
    (this->vertices).size_active = uVar27;
    (this->vertices).size_alloced = uVar27;
  }
  if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
    uVar24 = (ulong)(this->super_Geometry).numTimeSteps;
    uVar27 = (this->normals).size_alloced;
    uVar26 = uVar27;
    if ((uVar27 < uVar24) && (uVar26 = uVar24, uVar27 != 0)) {
      while (uVar26 = uVar27, uVar26 < uVar24) {
        uVar27 = uVar26 * 2 + (ulong)(uVar26 * 2 == 0);
      }
    }
    if (uVar24 < *psVar2) {
      if (uVar24 < *psVar2) {
        lVar22 = uVar24 * 0x38 + 0x30;
        uVar27 = uVar24;
        do {
          plVar9 = *(long **)((long)&(((this->normals).items)->super_RawBufferView).ptr_ofs + lVar22
                             );
          if (plVar9 != (long *)0x0) {
            (**(code **)(*plVar9 + 0x18))();
          }
          uVar27 = uVar27 + 1;
          lVar22 = lVar22 + 0x38;
        } while (uVar27 < *psVar2);
      }
      *psVar2 = uVar24;
    }
    if ((this->normals).size_alloced == uVar26) {
      uVar27 = *psVar2;
      lVar22 = uVar24 - uVar27;
      if (uVar27 <= uVar24 && lVar22 != 0) {
        lVar23 = uVar27 * 0x38 + 0x30;
        do {
          pBVar10 = (this->normals).items;
          puVar3 = (undefined8 *)((long)pBVar10 + lVar23 + -0x20);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)pBVar10 + lVar23 + -0x30);
          *puVar3 = 0;
          puVar3[1] = 0;
          *(undefined8 *)((long)pBVar10 + lVar23 + -0x10) = 0x100000000;
          *(undefined1 *)((long)pBVar10 + lVar23 + -8) = 1;
          *(undefined4 *)((long)pBVar10 + lVar23 + -4) = 0;
          *(undefined8 *)((long)&(pBVar10->super_RawBufferView).ptr_ofs + lVar23) = 0;
          lVar23 = lVar23 + 0x38;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      *psVar2 = uVar24;
    }
    else {
      pDVar6 = (this->normals).alloc.device;
      pBVar10 = (this->normals).items;
      iVar21 = (*(pDVar6->super_State).super_RefCount._vptr_RefCount[8])(pDVar6,uVar26 * 0x38,8);
      (this->normals).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var_00,iVar21);
      uVar27 = (this->normals).size_active;
      if (uVar27 != 0) {
        lVar22 = 0x30;
        uVar25 = 0;
        do {
          pBVar11 = (this->normals).items;
          puVar3 = (undefined8 *)((long)pBVar10 + lVar22 + -0x30);
          uVar16 = *puVar3;
          uVar17 = puVar3[1];
          puVar3 = (undefined8 *)((long)pBVar10 + lVar22 + -0x20);
          uVar18 = *puVar3;
          uVar19 = puVar3[1];
          puVar3 = (undefined8 *)((long)pBVar10 + lVar22 + -0x10);
          uVar20 = puVar3[1];
          puVar5 = (undefined8 *)((long)pBVar11 + lVar22 + -0x10);
          *puVar5 = *puVar3;
          puVar5[1] = uVar20;
          puVar3 = (undefined8 *)((long)pBVar11 + lVar22 + -0x20);
          *puVar3 = uVar18;
          puVar3[1] = uVar19;
          puVar3 = (undefined8 *)((long)pBVar11 + lVar22 + -0x30);
          *puVar3 = uVar16;
          puVar3[1] = uVar17;
          *(undefined8 *)((long)&(pBVar11->super_RawBufferView).ptr_ofs + lVar22) =
               *(undefined8 *)((long)&(pBVar10->super_RawBufferView).ptr_ofs + lVar22);
          *(undefined8 *)((long)&(pBVar10->super_RawBufferView).ptr_ofs + lVar22) = 0;
          uVar25 = uVar25 + 1;
          uVar27 = (this->normals).size_active;
          lVar22 = lVar22 + 0x38;
        } while (uVar25 < uVar27);
      }
      lVar22 = uVar24 - uVar27;
      if (uVar27 <= uVar24 && lVar22 != 0) {
        lVar23 = uVar27 * 0x38 + 0x30;
        do {
          pBVar11 = (this->normals).items;
          puVar3 = (undefined8 *)((long)pBVar11 + lVar23 + -0x20);
          *puVar3 = 0;
          puVar3[1] = 0;
          puVar3 = (undefined8 *)((long)pBVar11 + lVar23 + -0x30);
          *puVar3 = 0;
          puVar3[1] = 0;
          *(undefined8 *)((long)pBVar11 + lVar23 + -0x10) = 0x100000000;
          *(undefined1 *)((long)pBVar11 + lVar23 + -8) = 1;
          *(undefined4 *)((long)pBVar11 + lVar23 + -4) = 0;
          *(undefined8 *)((long)&(pBVar11->super_RawBufferView).ptr_ofs + lVar23) = 0;
          lVar23 = lVar23 + 0x38;
          lVar22 = lVar22 + -1;
        } while (lVar22 != 0);
      }
      pDVar6 = (this->normals).alloc.device;
      if (pDVar6 != (Device *)0x0) {
        (*(pDVar6->super_State).super_RefCount._vptr_RefCount[9])(pDVar6,pBVar10);
      }
      (this->normals).size_active = uVar24;
      (this->normals).size_alloced = uVar26;
    }
  }
  return;
}

Assistant:

Points::Points(Device* device, Geometry::GType gtype) : Geometry(device, gtype, 0, 1)
  {
    vertices.resize(numTimeSteps);
    if (getType() == GTY_ORIENTED_DISC_POINT)
      normals.resize(numTimeSteps);
  }